

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O2

void __thiscall
iDynTree::BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::computeMAP
          (BerdySparseMAPSolverPimpl *this,bool computePermutation)

{
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *mat;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *D;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *Y;
  SparseMatrix<double,_0,_int> *a;
  SparseMatrix<double,_0,_int> *a_00;
  VectorDynSize *vec;
  SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_> SVar1;
  plain_array<int,_2,_0,_0> pVar2;
  SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
  SVar3;
  Array<int,_2,_1,_0,_2,_1> AVar4;
  Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> local_3d8;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_398;
  IndexPointer piStack_380;
  IndexPointer local_378;
  IndexPointer piStack_370;
  ScalarPointer local_368;
  plain_array<int,_2,_0,_0> pStack_360;
  IndexPointer local_358;
  IndexPointer piStack_350;
  ScalarPointer local_348;
  IndexPointer piStack_340;
  Lhs local_330;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_2a0;
  SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *local_288;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *local_280;
  VectorDynSize *local_278;
  VectorDynSize *local_270;
  plain_array<int,_2,_0,_0> local_268;
  IndexPointer piStack_260;
  undefined1 local_258;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_250;
  SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_238;
  undefined1 local_1f8 [15];
  Index IStack_1e9;
  Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> local_1e0;
  int local_1a0 [2];
  IndexPointer piStack_198;
  undefined1 local_190;
  IndexPointer local_188;
  IndexPointer piStack_180;
  ScalarPointer local_178;
  IndexPointer piStack_170;
  Index local_15f;
  Index IStack_157;
  IndexPointer local_148;
  ScalarPointer pdStack_140;
  undefined1 local_138 [264];
  
  D = &this->dynamicsConstraintsMatrix;
  local_278 = &this->dynamicsConstraintsBias;
  Y = &this->measurementsMatrix;
  local_270 = &this->measurementsBias;
  BerdyHelper::getBerdyMatrices(this->berdy,D,local_278,Y,local_270);
  BerdyHelper::getOptions((BerdyOptions *)local_138,this->berdy);
  BerdyOptions::~BerdyOptions((BerdyOptions *)local_138);
  mat = &this->priorDynamicsRegularizationCovarianceInverse;
  a = &this->covarianceDynamicsPriorInverse;
  if (local_138._0_4_ == BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    toEigen((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)local_138,mat);
    Eigen::SparseMatrix<double,0,int>::operator=
              ((SparseMatrix<double,0,int> *)a,
               (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                *)local_138);
    iDynTree::VectorDynSize::operator=
              (&this->expectedDynamicsPrior,&this->priorDynamicsRegularizationExpectedValue);
  }
  else {
    toEigen((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)local_138,mat);
    Eigen::SparseMatrix<double,0,int>::operator=
              ((SparseMatrix<double,0,int> *)a,
               (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                *)local_138);
    toEigen(&local_1e0,D);
    SVar3.
    super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
    .m_isRValue = local_1e0.
                  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .
                  super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                  .
                  super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                  .m_isRValue;
    local_398._7_1_ =
         SUB81(local_1e0.
               super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_outerSize,0);
    local_398._8_7_ =
         SUB87((ulong)local_1e0.
                      super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_outerSize >> 8,0);
    local_398._15_1_ =
         SUB81(local_1e0.
               super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_innerSize,0);
    local_398._16_1_ =
         SUB81((ulong)local_1e0.
                      super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_innerSize >> 8,0);
    local_398._17_6_ =
         SUB86((ulong)local_1e0.
                      super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_innerSize >> 0x10,0);
    local_378 = local_1e0.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_outerIndex;
    piStack_370 = local_1e0.
                  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_innerIndices;
    local_368 = local_1e0.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_values;
    pStack_360.array =
         (int  [2])
         local_1e0.
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_innerNonZeros;
    local_280 = &this->priorDynamicsConstraintsCovarianceInverse;
    toEigen(&local_3d8,local_280);
    local_330.
    super_ProductImpl<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2,_Eigen::Sparse>
    .super_type.m_isRValue = (type)false;
    local_330.m_lhs.
    super_TransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Sparse>
    .
    super_SparseTransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1024>
    .
    super_SparseCompressedBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
    .
    super_SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
    .m_isRValue = (SparseTransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1024>
                   )(SparseCompressedBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
                     )0x0;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .
    super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
    .
    super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
    .m_isRValue = SVar3.
                  super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                  .m_isRValue;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_outerSize = CONCAT71(local_398._8_7_,local_398._7_1_);
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerSize = CONCAT62(local_398._17_6_,CONCAT11(local_398._16_1_,local_398._15_1_));
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
         local_1e0.
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
    ;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_outerIndex = local_378;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerIndices = piStack_370;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_values = local_368;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerNonZeros = (IndexPointer)pStack_360.array;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .
    super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
    .
    super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
    .m_isRValue = local_3d8.
                  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .
                  super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                  .
                  super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                  .m_isRValue;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_outerSize = local_3d8.
                   super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_outerSize;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerSize = local_3d8.
                   super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_innerSize;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
         local_3d8.
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
    ;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_outerIndex =
         local_3d8.
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_outerIndex;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerIndices =
         local_3d8.
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_innerIndices;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_values = local_3d8.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_values;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerNonZeros =
         local_3d8.
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_innerNonZeros;
    toEigen((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)&local_238,D);
    Eigen::
    Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
    ::Product((Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
               *)local_138,&local_330,(Rhs *)&local_238);
    Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::operator+=
              ((SparseMatrixBase<Eigen::SparseMatrix<double,0,int>> *)a,
               (SparseMatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>_>
                *)local_138);
    if (computePermutation) {
      Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::
      analyzePattern(&this->covarianceDynamicsPriorInverseDecomposition,a);
    }
    Eigen::
    SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
    ::factorize<true>(&(this->covarianceDynamicsPriorInverseDecomposition).
                       super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                      ,a);
    toEigen(&local_3d8,mat);
    toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_268,
            &this->priorDynamicsRegularizationExpectedValue);
    local_1e0.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .
    super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
    .
    super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
    .m_isRValue = local_3d8.
                  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .
                  super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                  .
                  super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                  .m_isRValue;
    local_1e0.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_outerSize = local_3d8.
                   super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_outerSize;
    local_1e0.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerSize = local_3d8.
                   super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_innerSize;
    local_1e0.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
         local_3d8.
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
    ;
    local_1e0.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_outerIndex =
         local_3d8.
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_outerIndex;
    local_1e0.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerIndices =
         local_3d8.
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_innerIndices;
    local_1e0.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_values = local_3d8.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_values;
    local_1e0.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerNonZeros =
         local_3d8.
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_innerNonZeros;
    local_1a0[0] = local_268.array[0];
    local_1a0[1] = local_268.array[1];
    piStack_198 = piStack_260;
    local_190 = local_258;
    toEigen((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)&local_238,D);
    IStack_157 = CONCAT71(local_238.m_innerSize._1_7_,(undefined1)local_238.m_innerSize);
    local_15f = local_238.m_outerSize;
    piStack_180 = (IndexPointer)
                  CONCAT71(local_238.m_innerIndices._1_7_,local_238.m_innerIndices._0_1_);
    local_188 = local_238.m_outerIndex;
    local_178 = local_238.m_values;
    piStack_170 = local_238.m_innerNonZeros;
    local_288 = &this->covarianceDynamicsPriorInverseDecomposition;
    toEigen((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)&local_378,
            local_280);
    pVar2.array = pStack_360.array;
    SVar1.m_isRValue = local_378._0_1_;
    local_148 = piStack_370;
    pdStack_140 = local_368;
    local_398._0_7_ = SUB87(local_358,0);
    local_398._7_1_ = SUB81((ulong)local_358 >> 0x38,0);
    local_398._8_7_ = SUB87(piStack_350,0);
    local_398._15_1_ = SUB81((ulong)piStack_350 >> 0x38,0);
    local_398._16_1_ = SUB81(local_348,0);
    local_398._17_6_ = SUB86((ulong)local_348 >> 8,0);
    local_398._23_1_ = SUB81((ulong)local_348 >> 0x38,0);
    piStack_380 = piStack_340;
    toEigen(&local_250,local_278);
    local_330.
    super_ProductImpl<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2,_Eigen::Sparse>
    .super_type.m_isRValue = (type)false;
    local_330.m_lhs.
    super_TransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Sparse>
    .
    super_SparseTransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1024>
    .
    super_SparseCompressedBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
    .
    super_SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
    .m_isRValue = (SparseTransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1024>
                   )(SparseCompressedBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
                     )0x0;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .
    super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
    .
    super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
    .m_isRValue = local_238.
                  super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                  .
                  super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                  .m_isRValue;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_outerSize = local_15f;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerSize = IStack_157;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
         local_238.m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.
         m_data.array;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_outerIndex = local_188;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerIndices = piStack_180;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_values = local_178;
    local_330.m_lhs.m_matrix.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerNonZeros = piStack_170;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .
    super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
    .
    super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
    .m_isRValue = (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                   )(SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                     )SVar1.m_isRValue;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_outerSize = (Index)local_148;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerSize = (Index)pdStack_140;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
         (PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>)
         (PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>)pVar2.array;
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_outerIndex = (IndexPointer)CONCAT17(local_398._7_1_,local_398._0_7_);
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerIndices = (IndexPointer)CONCAT17(local_398._15_1_,local_398._8_7_);
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_values = (ScalarPointer)
                CONCAT17(local_398._23_1_,CONCAT61(local_398._17_6_,local_398._16_1_));
    local_330.m_rhs.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_innerNonZeros = piStack_380;
    local_2a0._0_8_ = local_250._0_8_;
    local_2a0._8_8_ = local_250._8_8_;
    local_2a0._16_1_ = local_250._16_1_;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,0>>
    ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                 *)local_138,
                (MatrixBase<Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>>
                 *)&local_1e0,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                 *)&local_330);
    toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_1f8,
            &this->expectedDynamicsPriorRHS);
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>const,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,2>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>const>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_1f8,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                *)local_138);
    toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_138,
            &this->expectedDynamicsPriorRHS);
    local_1e0.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    ._0_8_ = local_288;
    local_1e0.
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
    .
    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_outerSize = (Index)local_138;
    toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_330,
            &this->expectedDynamicsPrior);
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Solve<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_330,
               (Solve<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_1e0);
  }
  toEigen(&local_1e0,Y);
  AVar4.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
       local_1e0.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
  SVar3.
  super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>.
  m_isRValue = local_1e0.
               super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
               .
               super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
               .
               super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
               .m_isRValue;
  local_398._7_1_ =
       SUB81(local_1e0.
             super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_outerSize,0);
  local_398._8_7_ =
       SUB87((ulong)local_1e0.
                    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_outerSize >> 8,0);
  local_398._15_1_ =
       SUB81(local_1e0.
             super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_innerSize,0);
  local_398._16_1_ =
       SUB81((ulong)local_1e0.
                    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_innerSize >> 8,0);
  local_398._17_6_ =
       SUB86((ulong)local_1e0.
                    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_innerSize >> 0x10,0);
  local_378 = local_1e0.
              super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_outerIndex;
  piStack_370 = local_1e0.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_innerIndices;
  local_368 = local_1e0.
              super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_values;
  pStack_360.array =
       (int  [2])
       local_1e0.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_innerNonZeros;
  toEigen(&local_3d8,&this->priorMeasurementsCovarianceInverse);
  local_330.
  super_ProductImpl<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2,_Eigen::Sparse>
  .super_type.m_isRValue = (type)false;
  local_330.m_lhs.
  super_TransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Sparse>
  .
  super_SparseTransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1024>
  .
  super_SparseCompressedBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
  .
  super_SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
  .m_isRValue = (SparseTransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1024>
                 )(SparseCompressedBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
                   )0x0;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
  .super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
  .m_isRValue = SVar3.
                super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                .m_isRValue;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_outerSize = CONCAT71(local_398._8_7_,local_398._7_1_);
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerSize = CONCAT62(local_398._17_6_,CONCAT11(local_398._16_1_,local_398._15_1_));
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
       AVar4.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_outerIndex = local_378;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerIndices = piStack_370;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_values = local_368;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerNonZeros = (IndexPointer)pStack_360.array;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
  .super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
  .m_isRValue = local_3d8.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .
                super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                .
                super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                .m_isRValue;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_outerSize = local_3d8.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_outerSize;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerSize = local_3d8.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_innerSize;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
       local_3d8.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_outerIndex = local_3d8.
                 super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_outerIndex;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerIndices =
       local_3d8.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_innerIndices;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_values = local_3d8.
             super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_values;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerNonZeros =
       local_3d8.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_innerNonZeros;
  toEigen((Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_> *)&local_238,Y);
  Eigen::
  Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
  ::Product((Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
             *)local_138,&local_330,(Rhs *)&local_238);
  a_00 = &this->covarianceDynamicsAPosterioriInverse;
  Eigen::SparseMatrix<double,0,int>::operator=
            ((SparseMatrix<double,0,int> *)a_00,
             (Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>
              *)local_138);
  Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,0,int>>::operator+=
            ((SparseMatrixBase<Eigen::SparseMatrix<double,0,int>> *)a_00,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)a);
  if (computePermutation) {
    Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::
    analyzePattern(&this->covarianceDynamicsAPosterioriInverseDecomposition,a_00);
  }
  Eigen::
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  ::factorize<true>(&(this->covarianceDynamicsAPosterioriInverseDecomposition).
                     super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                    ,a_00);
  toEigen(&local_1e0,Y);
  AVar4.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
       local_1e0.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
  SVar3.
  super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>.
  m_isRValue = local_1e0.
               super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
               .
               super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
               .
               super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
               .m_isRValue;
  local_1f8._7_8_ =
       local_1e0.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_outerSize;
  IStack_1e9 = local_1e0.
               super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_innerSize;
  local_378 = local_1e0.
              super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_outerIndex;
  piStack_370 = local_1e0.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_innerIndices;
  local_368 = local_1e0.
              super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_values;
  pStack_360.array =
       (int  [2])
       local_1e0.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_innerNonZeros;
  toEigen(&local_3d8,&this->priorMeasurementsCovarianceInverse);
  local_330.
  super_ProductImpl<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2,_Eigen::Sparse>
  .super_type.m_isRValue = (type)false;
  local_330.m_lhs.
  super_TransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Sparse>
  .
  super_SparseTransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1024>
  .
  super_SparseCompressedBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
  .
  super_SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
  .m_isRValue = (SparseTransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1024>
                 )(SparseCompressedBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
                   )0x0;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
  .super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
  .m_isRValue = SVar3.
                super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                .m_isRValue;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_outerSize = local_1f8._7_8_;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerSize = IStack_1e9;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
       AVar4.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_outerIndex = local_378;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerIndices = piStack_370;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_values = local_368;
  local_330.m_lhs.m_matrix.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerNonZeros = (IndexPointer)pStack_360.array;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
  .super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
  .m_isRValue = local_3d8.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .
                super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                .
                super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
                .m_isRValue;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_outerSize = local_3d8.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_outerSize;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerSize = local_3d8.
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_innerSize;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
       local_3d8.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_outerIndex = local_3d8.
                 super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_outerIndex;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerIndices =
       local_3d8.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_innerIndices;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_values = local_3d8.
             super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_values;
  local_330.m_rhs.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_innerNonZeros =
       local_3d8.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_innerNonZeros;
  toEigen(&local_398,&this->measurements);
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_268,
          local_270);
  local_238.m_innerSize._0_1_ = local_398._16_1_;
  local_238._7_1_ = local_398._7_1_;
  local_238._0_7_ = local_398._0_7_;
  local_238.m_outerSize = CONCAT17(local_398._15_1_,local_398._8_7_);
  local_238.m_zero_nnz.super_PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array = (PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>)
          (PlainObjectBase<Eigen::Array<int,_2,_1,_0,_2,_1>_>)local_268.array;
  local_238.m_outerIndex = piStack_260;
  local_238.m_innerIndices._0_1_ = local_258;
  Eigen::
  Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
  ::Product((Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
             *)local_138,&local_330,(Rhs *)&local_238);
  vec = &this->expectedDynamicsAPosterioriRHS;
  toEigen(&local_250,vec);
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::SparseMatrix<double,0,int>,0,Eigen::Stride<0,0>>,2>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>,0>>
            (&local_250,
             (Product<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
              *)local_138);
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_330,
          &this->expectedDynamicsPrior);
  local_138._8_8_ =
       CONCAT71(local_330._1_7_,
                local_330.
                super_ProductImpl<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_2,_Eigen::Sparse>
                .super_type.m_isRValue);
  local_138._16_8_ =
       CONCAT71(local_330.m_lhs._1_7_,
                local_330.m_lhs.
                super_TransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Sparse>
                .
                super_SparseTransposeImpl<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1024>
                .
                super_SparseCompressedBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
                .
                super_SparseMatrixBase<Eigen::Transpose<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>_>
                .m_isRValue);
  local_138[0x18] =
       local_330.m_lhs.m_matrix.
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>
       .
       super_SparseCompressedBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
       .
       super_SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>_>
       .m_isRValue;
  local_138._0_8_ = a;
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1e0,vec);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator+=
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
             &local_1e0,
             (MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
              *)local_138);
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_138,vec);
  local_1e0.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  _0_8_ = &this->covarianceDynamicsAPosterioriInverseDecomposition;
  local_1e0.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_SparseMapBase<Eigen::Map<Eigen::SparseMatrix<double,_0,_int>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_outerSize = (Index)local_138;
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_330,
          &this->expectedDynamicsAPosteriori);
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Solve<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>>
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_330,
             (Solve<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_1e0);
  return;
}

Assistant:

void BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::computeMAP(bool computePermutation)
    {
        /*
         * Get berdy matrices
         */
        berdy.getBerdyMatrices(dynamicsConstraintsMatrix,
                               dynamicsConstraintsBias,
                               measurementsMatrix,
                               measurementsBias);


        // Compute the maximum a posteriori probability
        // See Latella et al., "Whole-Body Human Inverse Dynamics with
        // Distributed Micro-Accelerometers, Gyros and Force Sensing" in Sensors, 2016

        // Intermediate quantities

        if(berdy.getOptions().berdyVariant!=BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
        {
            // Covariance matrix of the prior of the dynamics: var[p(d)], Eq. 10a
            //TODO: find a way to map to iDynTree::SparseMatrix
            covarianceDynamicsPriorInverse
            //    toEigen(m_intermediateQuantities.covarianceDynamicsPriorInverse)
            //Better to assign the "sum" before, and adding the product part later
            = toEigen(priorDynamicsRegularizationCovarianceInverse);

            covarianceDynamicsPriorInverse += toEigen(dynamicsConstraintsMatrix).transpose() * toEigen(priorDynamicsConstraintsCovarianceInverse) * toEigen(dynamicsConstraintsMatrix);

            // decompose m_covarianceDynamicsPriorInverse
            if (computePermutation) {
                covarianceDynamicsPriorInverseDecomposition.analyzePattern(covarianceDynamicsPriorInverse);
            }
            //    m_intermediateQuantities.covarianceDynamicsPriorInverseDecomposition.factorize(toEigen(m_intermediateQuantities.covarianceDynamicsPriorInverse));
            covarianceDynamicsPriorInverseDecomposition.factorize(covarianceDynamicsPriorInverse);

            // Expected value of the prior of the dynamics: E[p(d)], Eq. 10b
            toEigen(expectedDynamicsPriorRHS) = toEigen(priorDynamicsRegularizationCovarianceInverse) * toEigen(priorDynamicsRegularizationExpectedValue) - toEigen(dynamicsConstraintsMatrix).transpose() * toEigen(priorDynamicsConstraintsCovarianceInverse) * toEigen(dynamicsConstraintsBias);

            toEigen(expectedDynamicsPrior) =
            covarianceDynamicsPriorInverseDecomposition.solve(toEigen(expectedDynamicsPriorRHS));
        }
        else
        {
            // Modified eq. 10a and 10b without the dynamics constraints
            covarianceDynamicsPriorInverse = toEigen(priorDynamicsRegularizationCovarianceInverse);
            expectedDynamicsPrior = priorDynamicsRegularizationExpectedValue;
        }
        
        // Final result: covariance matrix of the whole-body dynamics, Eq. 11a
        //TODO: find a way to map to iDynTree::SparseMatrix
        covarianceDynamicsAPosterioriInverse = toEigen(measurementsMatrix).transpose() * toEigen(priorMeasurementsCovarianceInverse) * toEigen(measurementsMatrix);
        covarianceDynamicsAPosterioriInverse += covarianceDynamicsPriorInverse;


        // decompose m_covarianceDynamicsAPosterioriInverse
        if (computePermutation) {
            //        m_intermediateQuantities.covarianceDynamicsAPosterioriInverseDecomposition.analyzePattern(toEigen(m_covarianceDynamicsAPosterioriInverse));
            covarianceDynamicsAPosterioriInverseDecomposition.analyzePattern(covarianceDynamicsAPosterioriInverse);
        }
        //    m_intermediateQuantities.covarianceDynamicsAPosterioriInverseDecomposition.factorize(toEigen(m_covarianceDynamicsAPosterioriInverse));
        covarianceDynamicsAPosterioriInverseDecomposition.factorize(covarianceDynamicsAPosterioriInverse);

        // Final result: expected value of the whole-body dynamics, Eq. 11b
        toEigen(expectedDynamicsAPosterioriRHS) = toEigen(measurementsMatrix).transpose() * toEigen(priorMeasurementsCovarianceInverse) * (toEigen(measurements) - toEigen(measurementsBias));
        toEigen(expectedDynamicsAPosterioriRHS) += covarianceDynamicsPriorInverse * toEigen(expectedDynamicsPrior);
        
        toEigen(expectedDynamicsAPosteriori) =
        covarianceDynamicsAPosterioriInverseDecomposition.solve(toEigen(expectedDynamicsAPosterioriRHS));
    }